

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  char *pcVar2;
  char cVar3;
  char *pSop;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int *__ptr;
  void *pvVar7;
  Vec_Int_t *p;
  int *piVar8;
  uint *__ptr_00;
  Vec_Int_t *p_00;
  uint *__ptr_01;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  void *pvVar11;
  int iVar12;
  ulong uVar13;
  undefined4 uVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint Entry;
  char *pcVar20;
  ulong __n;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                  ,0x13d,"void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *)");
  }
  __ptr = (int *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar7 = malloc(100);
  *(void **)(__ptr + 2) = pvVar7;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar8 = (int *)malloc(400);
  p->pArray = piVar8;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar7 = malloc(400);
  *(void **)(__ptr_00 + 2) = pvVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(400);
  p_00->pArray = piVar8;
  __ptr_01 = (uint *)malloc(0x10);
  __ptr_01[0] = 100;
  __ptr_01[1] = 0;
  pvVar7 = malloc(400);
  *(void **)(__ptr_01 + 2) = pvVar7;
  pVVar9 = pNtk->vObjs;
  if (0 < pVVar9->nSize) {
    lVar16 = 0;
    do {
      pvVar7 = pVVar9->pArray[lVar16];
      if ((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) {
        pSop = *(char **)((long)pvVar7 + 0x38);
        uVar6 = Abc_SopGetVarNum(pSop);
        if (uVar6 != *(uint *)((long)pvVar7 + 0x1c)) {
          __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                        ,0x147,"void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *)");
        }
        lVar10 = (long)(int)uVar6;
        if ((int)*__ptr_00 < (int)uVar6) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar11 = malloc(lVar10 * 4);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr_00 + 2),lVar10 * 4);
          }
          *(void **)(__ptr_00 + 2) = pvVar11;
          if (pvVar11 == (void *)0x0) goto LAB_00842d10;
          *__ptr_00 = uVar6;
        }
        __n = (ulong)uVar6;
        if (0 < (int)uVar6) {
          memset(*(void **)(__ptr_00 + 2),0,__n * 4);
        }
        __ptr_00[1] = uVar6;
        if ((int)*__ptr_01 < (int)uVar6) {
          if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
            pvVar11 = malloc(lVar10 * 4);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr_01 + 2),lVar10 * 4);
          }
          *(void **)(__ptr_01 + 2) = pvVar11;
          if (pvVar11 == (void *)0x0) {
LAB_00842d10:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *__ptr_01 = uVar6;
        }
        if (0 < (int)uVar6) {
          memset(*(void **)(__ptr_01 + 2),0,__n * 4);
        }
        __ptr_01[1] = uVar6;
        if (*pSop != '\0') {
          iVar12 = 0;
          pcVar15 = pSop;
          do {
            if (0 < (int)uVar6) {
              uVar17 = 0;
              do {
                if (pcVar15[uVar17] != '-') {
                  piVar8 = (int *)(*(long *)(__ptr_00 + 2) + uVar17 * 4);
                  *piVar8 = *piVar8 + 1;
                  *(int *)(*(long *)(__ptr_01 + 2) + uVar17 * 4) = iVar12;
                }
                uVar17 = uVar17 + 1;
              } while (__n != uVar17);
            }
            iVar12 = iVar12 + 1;
            pcVar20 = pcVar15 + (int)(uVar6 + 3);
            pcVar15 = pcVar15 + (int)(uVar6 + 3);
          } while (*pcVar20 != '\0');
        }
        if (0 < (int)uVar6) {
          lVar4 = *(long *)(__ptr_00 + 2);
          uVar17 = 0;
          do {
            uVar14 = 1000000000;
            if (*(int *)(lVar4 + uVar17 * 4) == 1) {
              uVar14 = *(undefined4 *)(*(long *)(__ptr_01 + 2) + uVar17 * 4);
            }
            *(undefined4 *)(lVar4 + uVar17 * 4) = uVar14;
            uVar17 = uVar17 + 1;
          } while (__n != uVar17);
        }
        p->nSize = 0;
        if (0 < (int)uVar6) {
          Entry = 0;
          do {
            Vec_IntPush(p,Entry);
            Entry = Entry + 1;
          } while (uVar6 != Entry);
        }
        piVar8 = p->pArray;
        if (1 < (int)uVar6) {
          uVar13 = 1;
          uVar17 = 0;
          do {
            uVar1 = uVar17 + 1;
            uVar19 = uVar17 & 0xffffffff;
            uVar18 = uVar13;
            do {
              if ((uVar6 <= (uint)piVar8[uVar18]) || (uVar6 <= (uint)piVar8[(int)uVar19])) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar5 = uVar18 & 0xffffffff;
              if (*(int *)(*(long *)(__ptr_00 + 2) + (ulong)(uint)piVar8[(int)uVar19] * 4) <=
                  *(int *)(*(long *)(__ptr_00 + 2) + (ulong)(uint)piVar8[uVar18] * 4)) {
                uVar5 = uVar19;
              }
              uVar19 = uVar5;
              uVar18 = uVar18 + 1;
            } while (__n != uVar18);
            iVar12 = piVar8[uVar17];
            piVar8[uVar17] = piVar8[(int)uVar19];
            piVar8[(int)uVar19] = iVar12;
            uVar13 = uVar13 + 1;
            uVar17 = uVar1;
          } while (uVar1 != uVar6 - 1);
        }
        iVar12 = Abc_SopGetCubeNum(pSop);
        lVar10 = lVar10 + 3;
        iVar12 = iVar12 * (int)lVar10;
        if (*__ptr <= iVar12) {
          iVar12 = iVar12 + 1;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar11 = malloc((long)iVar12);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr + 2),(long)iVar12);
          }
          *(void **)(__ptr + 2) = pvVar11;
          *__ptr = iVar12;
        }
        pcVar15 = *(char **)(__ptr + 2);
        iVar12 = Abc_SopGetCubeNum(pSop);
        memcpy(pcVar15,pSop,(long)(iVar12 * (int)lVar10 + 1));
        cVar3 = *pcVar15;
        pcVar20 = pSop;
        while (cVar3 != '\0') {
          if (0 < (int)uVar6) {
            memset(pcVar20,0x2d,__n);
            uVar17 = 0;
            do {
              if ((pcVar15[piVar8[uVar17]] & 0xfeU) == 0x30) {
                pcVar20[uVar17] = pcVar15[piVar8[uVar17]];
              }
              uVar17 = uVar17 + 1;
            } while (__n != uVar17);
          }
          pcVar20 = pcVar20 + lVar10;
          pcVar2 = pcVar15 + lVar10;
          pcVar15 = pcVar15 + lVar10;
          cVar3 = *pcVar2;
        }
        *(char **)((long)pvVar7 + 0x38) = pSop;
        p_00->nSize = 0;
        if (0 < (int)uVar6) {
          uVar17 = 0;
          do {
            Vec_IntPush(p_00,*(int *)(*(long *)((long)pvVar7 + 0x20) + (long)piVar8[uVar17] * 4));
            uVar17 = uVar17 + 1;
          } while (__n != uVar17);
        }
        *(undefined4 *)((long)pvVar7 + 0x1c) = 0;
        iVar12 = p_00->nSize;
        if (0 < (long)iVar12) {
          piVar8 = p_00->pArray;
          lVar10 = 0;
          do {
            Vec_IntPush((Vec_Int_t *)((long)pvVar7 + 0x18),piVar8[lVar10]);
            lVar10 = lVar10 + 1;
          } while (iVar12 != lVar10);
        }
      }
      lVar16 = lVar16 + 1;
      pVVar9 = pNtk->vObjs;
    } while (lVar16 < pVVar9->nSize);
  }
  if (*(void **)(__ptr_01 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_01 + 2));
    __ptr_01[2] = 0;
    __ptr_01[3] = 0;
  }
  free(__ptr_01);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkOrderFaninsByLitCountAndCubeCount( Abc_Ntk_t * pNtk )
{
    // assuming that the fanins are sorted by the number of literals in each cube
    // this procedure sorts the literals appearing only once by the number of their cube
    Vec_Int_t * vOrder;
    Vec_Int_t * vCounts;
    Vec_Int_t * vFanins;
    Vec_Int_t * vCubeNum;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, iCube, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vStore = Vec_StrAlloc( 100 );
    vOrder = Vec_IntAlloc( 100 );
    vCounts = Vec_IntAlloc( 100 );
    vFanins = Vec_IntAlloc( 100 );
    vCubeNum = Vec_IntAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        // count literals and remember the cube where each literal appears
        Vec_IntFill( vCounts, nVars, 0 );
        Vec_IntFill( vCubeNum, nVars, 0 );
        iCube = 0;
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                if ( pCube[v] != '-' )
                {
                    Vec_IntAddToEntry( vCounts, v, 1 );
                    Vec_IntWriteEntry( vCubeNum, v, iCube );
                }
            iCube++;
        }
        // create new order
        for ( v = 0; v < nVars; v++ )
            if ( Vec_IntEntry(vCounts, v) == 1 )
                Vec_IntWriteEntry( vCounts, v, Vec_IntEntry(vCubeNum, v) );
            else
                Vec_IntWriteEntry( vCounts, v, ABC_INFINITY );
        // find good order
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, vCounts );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, (size_t)(Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1) );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        // generate the fanin order
        Vec_IntClear( vFanins );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vFanins, Abc_ObjFaninId( pNode, pOrder[v] ) );
        Vec_IntClear( &pNode->vFanins );
        Vec_IntAppend( &pNode->vFanins, vFanins );
    }
    Vec_IntFree( vCubeNum );
    Vec_IntFree( vFanins );
    Vec_IntFree( vCounts );
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}